

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_object_list_end(JSContext *ctx,JSObjectList *s)

{
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,s->object_tab);
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,s->hash_table);
  return;
}

Assistant:

static void js_object_list_end(JSContext *ctx, JSObjectList *s)
{
    js_free(ctx, s->object_tab);
    js_free(ctx, s->hash_table);
}